

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
diligent_spirv_cross::CompilerGLSL::ray_tracing_khr_fixup_locations(CompilerGLSL *this)

{
  size_t sVar1;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar2;
  Variant *pVVar3;
  bool bVar4;
  uint uVar5;
  SPIRVariable *var;
  uint32_t argument;
  long lVar6;
  LoopLock loop_lock;
  LoopLock LStack_38;
  
  ParsedIR::create_loop_hard_lock(&(this->super_Compiler).ir);
  sVar1 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
          buffer_size;
  if (sVar1 != 0) {
    pTVar2 = (this->super_Compiler).ir.ids_for_type[2].
             super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.ptr;
    lVar6 = 0;
    argument = 0;
    do {
      uVar5 = *(uint *)((long)&pTVar2->id + lVar6);
      pVVar3 = (this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.ptr;
      if (pVVar3[uVar5].type == TypeVariable) {
        var = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar3 + uVar5);
        uVar5 = var->storage - CallableDataKHR;
        if ((uVar5 < 0xf) && ((0x4403U >> (uVar5 & 0x1f) & 1) != 0)) {
          bVar4 = Compiler::is_hidden_variable(&this->super_Compiler,var,false);
          if (!bVar4) {
            Compiler::set_decoration
                      (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationLocation,
                       argument);
            argument = argument + 1;
          }
        }
      }
      lVar6 = lVar6 + 4;
    } while (sVar1 << 2 != lVar6);
  }
  ParsedIR::LoopLock::~LoopLock(&LStack_38);
  return;
}

Assistant:

void CompilerGLSL::ray_tracing_khr_fixup_locations()
{
	uint32_t location = 0;
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		// Incoming payload storage can also be used for tracing.
		if (var.storage != StorageClassRayPayloadKHR && var.storage != StorageClassCallableDataKHR &&
		    var.storage != StorageClassIncomingRayPayloadKHR && var.storage != StorageClassIncomingCallableDataKHR)
			return;
		if (is_hidden_variable(var))
			return;
		set_decoration(var.self, DecorationLocation, location++);
	});
}